

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

void __thiscall Fl_Check_Button_Type::ideal_size(Fl_Check_Button_Type *this,int *w,int *h)

{
  Fl_Widget_Type::ideal_size((Fl_Widget_Type *)this,w,h);
  *w = *w + (((this->super_Fl_Button_Type).super_Fl_Widget_Type.o)->label_).size * 2 + -8;
  *h = (*h / 5) * 5;
  *w = *w + 4;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Button_Type::ideal_size(w, h);
    w += 4;
  }